

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_util.cc
# Opt level: O2

bool bssl::IPAddressMatchesWithNetmask(Input addr1,Input addr2,Input mask)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong in_RCX;
  ulong in_RSI;
  ulong in_R9;
  size_t i;
  ulong idx;
  bool bVar5;
  Input local_60;
  Input local_50;
  Input local_40;
  
  if (in_RSI == in_R9 && in_RCX == in_RSI) {
    idx = 0;
    local_60.data_.size_ = in_RSI;
    do {
      bVar5 = local_60.data_.size_ <= idx;
      if (bVar5) {
        return bVar5;
      }
      bVar1 = der::Input::operator[](&local_60,idx);
      bVar2 = der::Input::operator[](&local_50,idx);
      bVar3 = der::Input::operator[](&local_40,idx);
      bVar4 = der::Input::operator[](&local_50,idx);
      idx = idx + 1;
    } while ((bVar2 & bVar1) == (bVar4 & bVar3));
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool IPAddressMatchesWithNetmask(der::Input addr1, der::Input addr2,
                                 der::Input mask) {
  if (addr1.size() != addr2.size() || addr1.size() != mask.size()) {
    return false;
  }
  for (size_t i = 0; i < addr1.size(); i++) {
    if ((addr1[i] & mask[i]) != (addr2[i] & mask[i])) {
      return false;
    }
  }
  return true;
}